

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcryptographichash.cpp
# Opt level: O0

void __thiscall
QMessageAuthenticationCodePrivate::setKey
          (QMessageAuthenticationCodePrivate *this,QByteArrayView newKey)

{
  QByteArrayView bytes;
  int iVar1;
  qsizetype qVar2;
  QSmallByteArray<144UL> *in_RDX;
  storage_type *in_RSI;
  QMessageAuthenticationCodePrivate *in_RDI;
  long in_FS_OFFSET;
  int blockSize;
  QCryptographicHashPrivate *in_stack_ffffffffffffffb8;
  int iVar3;
  undefined7 uVar4;
  quint8 v;
  storage_type *in_stack_ffffffffffffffd8;
  QSmallByteArray<144UL> *in_stack_ffffffffffffffe0;
  QByteArrayView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = SUB87(in_RDI,0);
  v = (quint8)((ulong)in_RDI >> 0x38);
  local_18.m_size = (qsizetype)in_RSI;
  local_18.m_data = (storage_type *)in_RDX;
  iVar1 = qt_hash_block_size((in_RDI->messageHash).method);
  iVar3 = iVar1;
  qVar2 = QByteArrayView::size(&local_18);
  if (iVar3 < qVar2) {
    bytes.m_size._7_1_ = v;
    bytes.m_size._0_7_ = uVar4;
    bytes.m_data = (storage_type *)local_18.m_size;
    QCryptographicHashPrivate::addData(in_stack_ffffffffffffffb8,bytes);
    QCryptographicHashPrivate::finalizeUnchecked((QCryptographicHashPrivate *)in_RDI);
    QSmallByteArray<144UL>::operator=<64UL,_true>
              (&in_RDI->key,(QSmallByteArray<64UL> *)in_stack_ffffffffffffffb8);
    QCryptographicHashPrivate::reset((QCryptographicHashPrivate *)in_RDI);
    in_stack_ffffffffffffffd8 = (storage_type *)local_18.m_size;
    in_stack_ffffffffffffffe0 = (QSmallByteArray<144UL> *)local_18.m_data;
  }
  else {
    QSmallByteArray<144UL>::assign<QByteArrayView>
              ((QSmallByteArray<144UL> *)CONCAT17(v,uVar4),(QByteArrayView *)CONCAT44(iVar3,iVar1));
  }
  qVar2 = QSmallByteArray<144UL>::size(&in_RDI->key);
  if (qVar2 < iVar3) {
    QSmallByteArray<144UL>::resize(in_stack_ffffffffffffffe0,(qsizetype)in_stack_ffffffffffffffd8,v)
    ;
  }
  initMessageHash(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMessageAuthenticationCodePrivate::setKey(QByteArrayView newKey) noexcept
{
    const int blockSize = qt_hash_block_size(messageHash.method);

    if (newKey.size() > blockSize) {
        messageHash.addData(newKey);
        messageHash.finalizeUnchecked();
        static_assert([] {
                using A = QCryptographicHash::Algorithm;
                for (int i = 0; i < A::NumAlgorithms; ++i) {
                    if (hashLengthInternal(A(i)) > qt_hash_block_size(A(i)))
                        return false;
                }
                return true;
            }(), "this code assumes that a hash's result always fits into that hash's block size");
        key = messageHash.result;
        messageHash.reset();
    } else {
        key.assign(newKey);
    }

    if (key.size() < blockSize)
        key.resize(blockSize, '\0');

    initMessageHash();
}